

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int cuddGa(DdManager *table,int lower,int upper)

{
  int iVar1;
  int *local_40;
  int *pointer;
  int local_30;
  int small;
  int index;
  int m;
  int n;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  n = upper;
  i = lower;
  _upper_local = table;
  iVar1 = cuddSifting(table,lower,upper);
  if (iVar1 == 0) {
    table_local._4_4_ = 0;
  }
  else {
    numvars = (n - i) + 1;
    if (_upper_local->populationSize == 0) {
      popsize = numvars * 3;
      if (0x78 < popsize) {
        popsize = 0x78;
      }
    }
    else {
      popsize = _upper_local->populationSize;
    }
    if (popsize < 4) {
      popsize = 4;
    }
    storedd = (int *)malloc((long)((popsize + 2) * ((n - i) + 2)) << 2);
    if (storedd == (int *)0x0) {
      _upper_local->errorCode = CUDD_MEMORY_OUT;
      table_local._4_4_ = 0;
    }
    else {
      repeat = (int *)malloc((long)popsize << 2);
      if (repeat == (int *)0x0) {
        _upper_local->errorCode = CUDD_MEMORY_OUT;
        if (storedd != (int *)0x0) {
          free(storedd);
          storedd = (int *)0x0;
        }
        table_local._4_4_ = 0;
      }
      else {
        for (m = 0; m < popsize; m = m + 1) {
          repeat[m] = 0;
        }
        computed = st__init_table(array_compare,array_hash);
        if (computed == (st__table *)0x0) {
          _upper_local->errorCode = CUDD_MEMORY_OUT;
          if (storedd != (int *)0x0) {
            free(storedd);
            storedd = (int *)0x0;
          }
          if (repeat != (int *)0x0) {
            free(repeat);
            repeat = (int *)0x0;
          }
          table_local._4_4_ = 0;
        }
        else {
          for (m = 0; m < numvars; m = m + 1) {
            storedd[m] = _upper_local->invperm[m + i];
          }
          storedd[numvars] = _upper_local->keys - _upper_local->isolated;
          iVar1 = st__insert(computed,(char *)storedd,(char *)0x0);
          if (iVar1 == -10000) {
            if (storedd != (int *)0x0) {
              free(storedd);
              storedd = (int *)0x0;
            }
            if (repeat != (int *)0x0) {
              free(repeat);
              repeat = (int *)0x0;
            }
            st__free_table(computed);
            table_local._4_4_ = 0;
          }
          else {
            *repeat = *repeat + 1;
            for (m = 0; m < numvars; m = m + 1) {
              storedd[numvars * 2 - m] = _upper_local->invperm[m + i];
            }
            iVar1 = make_random(_upper_local,i);
            if (iVar1 == 0) {
              _upper_local->errorCode = CUDD_MEMORY_OUT;
              if (storedd != (int *)0x0) {
                free(storedd);
                storedd = (int *)0x0;
              }
              if (repeat != (int *)0x0) {
                free(repeat);
                repeat = (int *)0x0;
              }
              st__free_table(computed);
              table_local._4_4_ = 0;
            }
            else {
              for (m = 1; m < popsize; m = m + 1) {
                result = build_dd(_upper_local,m,i,n);
                if (result == 0) {
                  if (storedd != (int *)0x0) {
                    free(storedd);
                    storedd = (int *)0x0;
                  }
                  if (repeat != (int *)0x0) {
                    free(repeat);
                    repeat = (int *)0x0;
                  }
                  st__free_table(computed);
                  return 0;
                }
                iVar1 = st__lookup_int(computed,(char *)(storedd + m * (numvars + 1)),&local_30);
                if (iVar1 == 0) {
                  iVar1 = st__insert(computed,(char *)(storedd + m * (numvars + 1)),(char *)(long)m)
                  ;
                  if (iVar1 == -10000) {
                    if (storedd != (int *)0x0) {
                      free(storedd);
                      storedd = (int *)0x0;
                    }
                    if (repeat != (int *)0x0) {
                      free(repeat);
                      repeat = (int *)0x0;
                    }
                    st__free_table(computed);
                    return 0;
                  }
                  repeat[m] = repeat[m] + 1;
                }
                else {
                  repeat[local_30] = repeat[local_30] + 1;
                }
              }
              pointer._4_4_ = find_best();
              if (_upper_local->numberXovers == 0) {
                cross = numvars * 3;
                if (0x3c < cross) {
                  cross = 0x3c;
                }
              }
              else {
                cross = _upper_local->numberXovers;
              }
              for (small = 0; small < cross; small = small + 1) {
                iVar1 = PMX(_upper_local->size);
                if (iVar1 == 0) {
                  _upper_local->errorCode = CUDD_MEMORY_OUT;
                  if (storedd != (int *)0x0) {
                    free(storedd);
                    storedd = (int *)0x0;
                  }
                  if (repeat != (int *)0x0) {
                    free(repeat);
                    repeat = (int *)0x0;
                  }
                  st__free_table(computed);
                  return 0;
                }
                for (m = popsize; m <= popsize + 1; m = m + 1) {
                  result = build_dd(_upper_local,m,i,n);
                  if (result == 0) {
                    if (storedd != (int *)0x0) {
                      free(storedd);
                      storedd = (int *)0x0;
                    }
                    if (repeat != (int *)0x0) {
                      free(repeat);
                      repeat = (int *)0x0;
                    }
                    st__free_table(computed);
                    return 0;
                  }
                  large = largest();
                  if (storedd[m * (numvars + 1) + numvars] <
                      storedd[large * (numvars + 1) + numvars]) {
                    result = st__lookup_int(computed,(char *)(storedd + large * (numvars + 1)),
                                            &local_30);
                    if (result == 0) {
                      if (storedd != (int *)0x0) {
                        free(storedd);
                        storedd = (int *)0x0;
                      }
                      if (repeat != (int *)0x0) {
                        free(repeat);
                        repeat = (int *)0x0;
                      }
                      st__free_table(computed);
                      return 0;
                    }
                    repeat[local_30] = repeat[local_30] + -1;
                    if (repeat[local_30] == 0) {
                      local_40 = storedd + local_30 * (numvars + 1);
                      result = st__delete(computed,(char **)&local_40,(char **)0x0);
                      if (result == 0) {
                        if (storedd != (int *)0x0) {
                          free(storedd);
                          storedd = (int *)0x0;
                        }
                        if (repeat != (int *)0x0) {
                          free(repeat);
                          repeat = (int *)0x0;
                        }
                        st__free_table(computed);
                        return 0;
                      }
                    }
                    for (index = 0; index <= numvars; index = index + 1) {
                      storedd[large * (numvars + 1) + index] = storedd[m * (numvars + 1) + index];
                    }
                    iVar1 = st__lookup_int(computed,(char *)(storedd + large * (numvars + 1)),
                                           &local_30);
                    if (iVar1 == 0) {
                      iVar1 = st__insert(computed,(char *)(storedd + large * (numvars + 1)),
                                         (char *)(long)large);
                      if (iVar1 == -10000) {
                        if (storedd != (int *)0x0) {
                          free(storedd);
                          storedd = (int *)0x0;
                        }
                        if (repeat != (int *)0x0) {
                          free(repeat);
                          repeat = (int *)0x0;
                        }
                        st__free_table(computed);
                        return 0;
                      }
                      repeat[large] = repeat[large] + 1;
                    }
                    else {
                      repeat[local_30] = repeat[local_30] + 1;
                    }
                  }
                }
              }
              pointer._4_4_ = find_best();
              st__free_table(computed);
              computed = (st__table *)0x0;
              result = build_dd(_upper_local,pointer._4_4_,i,n);
              if (storedd != (int *)0x0) {
                free(storedd);
                storedd = (int *)0x0;
              }
              if (repeat != (int *)0x0) {
                free(repeat);
                repeat = (int *)0x0;
              }
              table_local._4_4_ = result;
            }
          }
        }
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

int
cuddGa(
  DdManager * table /* manager */,
  int  lower /* lowest level to be reordered */,
  int  upper /* highest level to be reorderded */)
{
    int         i,n,m;          /* dummy/loop vars */
    int         index;
#ifdef DD_STATS
    double      average_fitness;
#endif
    int         small;          /* index of smallest DD in population */

    /* Do an initial sifting to produce at least one reasonable individual. */
    if (!cuddSifting(table,lower,upper)) return(0);

    /* Get the initial values. */
    numvars = upper - lower + 1; /* number of variables to be reordered */
    if (table->populationSize == 0) {
        popsize = 3 * numvars;  /* population size is 3 times # of vars */
        if (popsize > 120) {
            popsize = 120;      /* Maximum population size is 120 */
        }
    } else {
        popsize = table->populationSize;  /* user specified value */
    }
    if (popsize < 4) popsize = 4;       /* enforce minimum population size */

    /* Allocate population table. */
    storedd = ABC_ALLOC(int,(popsize+2)*(numvars+1));
    if (storedd == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    /* Initialize the computed table. This table is made up of two data
    ** structures: A hash table with the key given by the order, which says
    ** if a given order is present in the population; and the repeat
    ** vector, which says how many copies of a given order are stored in
    ** the population table. If there are multiple copies of an order, only
    ** one has a repeat count greater than 1. This copy is the one pointed
    ** by the computed table.
    */
    repeat = ABC_ALLOC(int,popsize);
    if (repeat == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        return(0);
    }
    for (i = 0; i < popsize; i++) {
        repeat[i] = 0;
    }
    computed = st__init_table(array_compare,array_hash);
    if (computed == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        return(0);
    }

    /* Copy the current DD and its size to the population table. */
    for (i = 0; i < numvars; i++) {
        STOREDD(0,i) = table->invperm[i+lower]; /* order of initial DD */
    }
    STOREDD(0,numvars) = table->keys - table->isolated; /* size of initial DD */

    /* Store the initial order in the computed table. */
    if ( st__insert(computed,(char *)storedd,(char *) 0) == st__OUT_OF_MEM) {
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    repeat[0]++;

    /* Insert the reverse order as second element of the population. */
    for (i = 0; i < numvars; i++) {
        STOREDD(1,numvars-1-i) = table->invperm[i+lower]; /* reverse order */
    }

    /* Now create the random orders. make_random fills the population
    ** table with random permutations. The successive loop builds and sifts
    ** the DDs for the reverse order and each random permutation, and stores
    ** the results in the computed table.
    */
    if (!make_random(table,lower)) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    for (i = 1; i < popsize; i++) {
        result = build_dd(table,i,lower,upper); /* build and sift order */
        if (!result) {
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        if ( st__lookup_int(computed,(char *)&STOREDD(i,0),&index)) {
            repeat[index]++;
        } else {
            if ( st__insert(computed,(char *)&STOREDD(i,0),(char *)(long)i) ==
            st__OUT_OF_MEM) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            repeat[i]++;
        }
    }

#if 0
#ifdef DD_STATS
    /* Print the initial population. */
    (void) fprintf(table->out,"Initial population after sifting\n");
    for (m = 0; m < popsize; m++) {
        for (i = 0; i < numvars; i++) {
            (void) fprintf(table->out," %2d",STOREDD(m,i));
        }
        (void) fprintf(table->out," : %3d (%d)\n",
                       STOREDD(m,numvars),repeat[m]);
    }
#endif
#endif

    small = find_best();
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nInitial population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Decide how many crossovers should be tried. */
    if (table->numberXovers == 0) {
        cross = 3*numvars;
        if (cross > 60) {       /* do a maximum of 50 crossovers */
            cross = 60;
        }
    } else {
        cross = table->numberXovers;      /* use user specified value */
    }

    /* Perform the crossovers to get the best order. */
    for (m = 0; m < cross; m++) {
        if (!PMX(table->size)) {        /* perform one crossover */
            table->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        /* The offsprings are left in the last two entries of the
        ** population table. These are now considered in turn.
        */
        for (i = popsize; i <= popsize+1; i++) {
            result = build_dd(table,i,lower,upper); /* build and sift child */
            if (!result) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            large = largest();  /* find the largest DD in population */

            /* If the new child is smaller than the largest DD in the current
            ** population, enter it into the population in place of the
            ** largest DD.
            */
            if (STOREDD(i,numvars) < STOREDD(large,numvars)) {
                /* Look up the largest DD in the computed table.
                ** Decrease its repetition count. If the repetition count
                ** goes to 0, remove the largest DD from the computed table.
                */
                result = st__lookup_int(computed,(char *)&STOREDD(large,0),
                                       &index);
                if (!result) {
                    ABC_FREE(storedd);
                    ABC_FREE(repeat);
                    st__free_table(computed);
                    return(0);
                }
                repeat[index]--;
                if (repeat[index] == 0) {
                    int *pointer = &STOREDD(index,0);
                    result = st__delete(computed, (const char **)&pointer, NULL);
                    if (!result) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                }
                /* Copy the new individual to the entry of the
                ** population table just made available and update the
                ** computed table.
                */
                for (n = 0; n <= numvars; n++) {
                    STOREDD(large,n) = STOREDD(i,n);
                }
                if ( st__lookup_int(computed,(char *)&STOREDD(large,0),
                                  &index)) {
                    repeat[index]++;
                } else {
                    if ( st__insert(computed,(char *)&STOREDD(large,0),
                    (char *)(long)large) == st__OUT_OF_MEM) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                    repeat[large]++;
                }
            }
        }
    }

    /* Find the smallest DD in the population and build it;
    ** that will be the result.
    */
    small = find_best();

    /* Print stats on the final population. */
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nFinal population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Clean up, build the result DD, and return. */
    st__free_table(computed);
    computed = NULL;
    result = build_dd(table,small,lower,upper);
    ABC_FREE(storedd);
    ABC_FREE(repeat);
    return(result);

}